

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

kp_error_t list_dir_r(char ***safes,int *nsafes,char *root)

{
  int iVar1;
  long lVar2;
  DIR *__dirp;
  dirent *pdVar3;
  ulong uVar4;
  char **ppcVar5;
  char *pcVar6;
  int *piVar7;
  long in_FS_OFFSET;
  kp_error_t local_103c;
  char path [4096];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  __dirp = opendir(root);
  if (__dirp == (DIR *)0x0) {
    local_103c = 5;
    kp_warn(5,"cannot open dir %s",root);
  }
  else {
    local_103c = 0;
LAB_001061d6:
    pdVar3 = readdir(__dirp);
    if (pdVar3 != (dirent *)0x0) {
      if ((pdVar3->d_name[0] != '.') && ((pdVar3->d_type == '\b' || (pdVar3->d_type == '\x04')))) {
        uVar4 = strlcpy(path,root,0x1000);
        if ((uVar4 < 0x1000) &&
           ((uVar4 = strlcat(path,"/",0x1000), uVar4 < 0x1000 &&
            (uVar4 = strlcat(path,pdVar3->d_name,0x1000), uVar4 < 0x1000)))) {
          if (pdVar3->d_type == '\x04') {
            local_103c = list_dir_r(safes,nsafes,path);
            goto LAB_001061d6;
          }
          if (pdVar3->d_type != '\b') goto LAB_001061d6;
          ppcVar5 = (char **)reallocarray(*safes,(long)*nsafes + 1,8);
          *safes = ppcVar5;
          if (ppcVar5 != (char **)0x0) {
            pcVar6 = strndup(path,0x1000);
            iVar1 = *nsafes;
            ppcVar5[iVar1] = pcVar6;
            if ((*safes)[iVar1] != (char *)0x0) {
              *nsafes = iVar1 + 1;
              goto LAB_001061d6;
            }
          }
        }
        piVar7 = __errno_location();
        *piVar7 = 0xc;
        local_103c = 5;
        kp_warn(5,"memory error");
        goto LAB_00106307;
      }
      goto LAB_001061d6;
    }
LAB_00106307:
    closedir(__dirp);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_103c;
}

Assistant:

static kp_error_t
list_dir_r(char ***safes, int *nsafes, char *root)
{
	kp_error_t ret = KP_SUCCESS;
	DIR *dirp;
	struct dirent *dirent;

	if ((dirp = opendir(root)) == NULL) {
		ret = KP_ERRNO;
		kp_warn(ret, "cannot open dir %s", root);
		return ret;
	}

	while ((dirent = readdir(dirp)) != NULL) {
		char path[PATH_MAX];
		if (dirent->d_name[0] == '.'
				|| (dirent->d_type != DT_REG
				&& dirent->d_type != DT_DIR)) {
			continue;
		}

		if (strlcpy(path, root, PATH_MAX) >= PATH_MAX) {
			errno = ENOMEM;
			ret = KP_ERRNO;
			kp_warn(ret, "memory error");
			goto out;
		}

		if (strlcat(path, "/", PATH_MAX) >= PATH_MAX) {
			errno = ENOMEM;
			ret = KP_ERRNO;
			kp_warn(ret, "memory error");
			goto out;
		}

		if (strlcat(path, dirent->d_name, PATH_MAX) >= PATH_MAX) {
			errno = ENOMEM;
			ret = KP_ERRNO;
			kp_warn(ret, "memory error");
			goto out;
		}

		switch (dirent->d_type) {
		case DT_REG:
			if ((*safes = reallocarray(*safes, *nsafes + 1, sizeof(char *)))
					== NULL) {
				errno = ENOMEM;
				ret = KP_ERRNO;
				kp_warn(ret, "memory error");
				goto out;
			}

			(*safes)[*nsafes] = strndup(path, PATH_MAX);
			if ((*safes)[*nsafes] == NULL) {
				errno = ENOMEM;
				ret = KP_ERRNO;
				kp_warn(ret, "memory error");
				goto out;
			}

			(*nsafes)++;
			break;
		case DT_DIR:
			ret = list_dir_r(safes, nsafes, path);
		}
	}

out:
	closedir(dirp);

	return ret;
}